

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popups.cpp
# Opt level: O1

bool __thiscall CEditor::PopupSelectDoodadRuleSet(CEditor *this,void *pContext,CUIRect View)

{
  IAutoMapper *pIVar1;
  int iVar2;
  CLayer *pCVar3;
  undefined4 extraout_var;
  bool bVar4;
  ulong uVar5;
  int *pID;
  long in_FS_OFFSET;
  CUIRect Button;
  CUIRect local_58;
  CUIRect local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = View;
  pCVar3 = GetSelectedLayer(this,0);
  pIVar1 = (this->m_Map).m_lImages.list[*(int *)&pCVar3[1].m_pEditor]->m_pAutoMapper;
  iVar2 = (*pIVar1->_vptr_IAutoMapper[5])(pIVar1);
  bVar4 = 0 < iVar2;
  if (0 < iVar2) {
    pID = PopupSelectDoodadRuleSet::s_AutoMapperDoodadButtons;
    uVar5 = 0;
    do {
      CUIRect::HSplitTop(&local_48,2.0,(CUIRect *)0x0,&local_48);
      CUIRect::HSplitTop(&local_48,12.0,&local_58,&local_48);
      iVar2 = (*pIVar1->_vptr_IAutoMapper[6])(pIVar1,uVar5 & 0xffffffff);
      iVar2 = DoButton_Editor(this,pID,(char *)CONCAT44(extraout_var,iVar2),0,&local_58,0,
                              (char *)0x0);
      if (iVar2 != 0) {
        pCVar3[2].m_Flags = (int)uVar5;
        break;
      }
      uVar5 = uVar5 + 1;
      iVar2 = (*pIVar1->_vptr_IAutoMapper[5])(pIVar1);
      pID = pID + 1;
      bVar4 = (long)uVar5 < (long)iVar2;
    } while ((long)uVar5 < (long)iVar2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar4;
}

Assistant:

bool CEditor::PopupSelectDoodadRuleSet(void *pContext, CUIRect View)
{
	CEditor *pEditor = (CEditor *)pContext;
	CLayerTiles *pLayer = static_cast<CLayerTiles*>(pEditor->GetSelectedLayer(0));
	CUIRect Button;
	static int s_AutoMapperDoodadButtons[IAutoMapper::MAX_RULES];
	IAutoMapper *pMapper = pEditor->m_Map.m_lImages[pLayer->m_Image]->m_pAutoMapper;

	for(int i = 0; i < pMapper->RuleSetNum(); ++i)
	{
		View.HSplitTop(2.0f, 0, &View);
		View.HSplitTop(12.0f, &Button, &View);
		if(pEditor->DoButton_Editor(&s_AutoMapperDoodadButtons[i], pMapper->GetRuleSetName(i), 0, &Button, 0, 0))
		{
			pLayer->m_SelectedRuleSet = i;
			return true; // close the popup
		}
	}

	return false;
}